

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O2

int __thiscall
kj::anon_unknown_9::DiskFile::copy(DiskFile *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  uint __fd;
  Fault FVar1;
  int iVar2;
  int iVar3;
  Exception *pEVar4;
  ulong uVar5;
  __off64_t _Var6;
  ssize_t sVar7;
  size_t __n;
  ulong uVar8;
  Exception *in_RCX;
  int line;
  stat *__buf;
  stat *__buf_00;
  Exception *pEVar9;
  DiskHandle *this_00;
  ulong uVar10;
  ulong in_R8;
  Exception *pEVar11;
  size_t __nbytes;
  uint64_t size;
  EVP_PKEY_CTX *pEVar12;
  Fault f_2;
  Fault f;
  long local_1030;
  
  (*(code *)**(undefined8 **)src)(&f,src);
  if ((char)f.exception != '\x01') {
    iVar2 = File::copy(&this->super_File,dst,src);
    return iVar2;
  }
  this_00 = &this->super_DiskHandle;
  __fd = f.exception._4_4_;
  pEVar11 = (Exception *)(long)(int)f.exception._4_4_;
  pEVar9 = in_RCX;
  if (in_R8 == 0xffffffffffffffff && (in_RCX == (Exception *)0x0 && dst == (EVP_PKEY_CTX *)0x0)) {
    DiskHandle::stat((DiskHandle *)&f,(char *)this_00,__buf);
    if (local_1030 == 0) {
      iVar2 = ioctl((this_00->fd).fd,0x40049409,(ulong)__fd);
      pEVar11 = (Exception *)0x7fffffffffffffff;
      if (-1 < iVar2) {
        DiskHandle::stat((DiskHandle *)&f,(char *)this_00,__buf_00);
        return 0;
      }
      goto LAB_0041aa67;
    }
  }
  else if (in_R8 == 0) {
    return 0;
  }
  f_2.exception = pEVar11;
  iVar2 = ioctl((this_00->fd).fd,0x4020940d);
  if (-1 < iVar2) {
    (**(code **)(*(long *)src + 0x10))(&f,src);
    uVar5 = local_1030 - (long)in_RCX;
    if (in_R8 <= (ulong)(local_1030 - (long)in_RCX)) {
      uVar5 = in_R8;
    }
    return (int)uVar5;
  }
  pEVar11 = (Exception *)0x7fffffffffffffff;
  if (in_R8 != 0xffffffffffffffff) {
    pEVar11 = (Exception *)((long)in_RCX->trace + (in_R8 - 0x68));
  }
LAB_0041aa67:
  pEVar4 = (Exception *)lseek64(__fd,(__off64_t)pEVar9,4);
  iVar2 = (int)in_RCX;
  if ((long)pEVar4 < 0) {
    iVar3 = kj::_::Debug::getOsErrorNumber(false);
    if (iVar3 == -1) goto LAB_0041aa67;
    if ((iVar3 != 0) && (pEVar4 = pEVar11, iVar3 != 0x16)) {
      if (iVar3 == 6) goto LAB_0041ad27;
      line = 0x259;
      goto LAB_0041ad82;
    }
  }
  if ((long)pEVar11 < (long)pEVar4) {
    pEVar4 = pEVar11;
  }
  uVar5 = (long)pEVar4 - (long)pEVar9;
  if (uVar5 != 0) {
    do {
      _Var6 = lseek64((this_00->fd).fd,(__off64_t)dst,0);
      FVar1.exception = pEVar9;
      if (-1 < _Var6) goto LAB_0041aadf;
      iVar3 = kj::_::Debug::getOsErrorNumber(false);
    } while (iVar3 == -1);
    if (iVar3 != 0) {
      kj::_::Debug::Fault::Fault
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,0x206,iVar3,"lseek(fd, offset, SEEK_SET)","");
      kj::_::Debug::Fault::fatal(&f);
    }
LAB_0041aadf:
    do {
      f.exception = FVar1.exception;
      if ((long)pEVar4 <= (long)f.exception) goto LAB_0041ac54;
      do {
        sVar7 = sendfile64((this_00->fd).fd,__fd,(__off64_t *)&f,(long)pEVar4 - (long)f.exception);
        if (-1 < sVar7) {
          FVar1 = f;
          if (sVar7 == 0) goto LAB_0041ac54;
          goto LAB_0041aadf;
        }
        iVar3 = kj::_::Debug::getOsErrorNumber(false);
      } while (iVar3 == -1);
      FVar1 = f;
      if (iVar3 != 0) {
        if ((iVar3 == 0x16) || (iVar3 == 0x26)) {
          uVar8 = 0;
          pEVar4 = pEVar9;
          pEVar12 = dst;
          for (uVar10 = uVar5; uVar10 != 0; uVar10 = uVar10 - __n) {
            memset(&f,0,0x1000);
            __nbytes = 0x1000;
            if (uVar10 < 0x1000) {
              __nbytes = uVar10;
            }
            do {
              __n = pread64(__fd,&f,__nbytes,(__off64_t)pEVar4);
              if (-1 < (long)__n) {
                if (__n == 0) goto LAB_0041ac57;
                goto LAB_0041abb6;
              }
              iVar3 = kj::_::Debug::getOsErrorNumber(false);
            } while (iVar3 == -1);
            if (iVar3 != 0) {
              kj::_::Debug::Fault::Fault
                        (&f_2,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                         ,0x21d,iVar3,
                         "n = pread(fromFd, buffer, kj::min(sizeof(buffer), size), fromOffset)","");
              kj::_::Debug::Fault::fatal(&f_2);
            }
LAB_0041abb6:
            DiskHandle::write(this_00,(int)pEVar12,&f,__n);
            pEVar4 = (Exception *)((long)pEVar4->trace + (__n - 0x68));
            pEVar12 = pEVar12 + __n;
            uVar8 = uVar8 + __n;
          }
        }
        else {
          kj::_::Debug::Fault::Fault
                    (&f_2,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                     ,0x210,iVar3,"sendfile","");
          uVar8 = (long)f.exception - (long)pEVar9;
          kj::_::Debug::Fault::~Fault(&f_2);
        }
        goto LAB_0041ac57;
      }
    } while( true );
  }
  goto LAB_0041ac68;
LAB_0041ac54:
  uVar8 = (long)f.exception - (long)pEVar9;
LAB_0041ac57:
  pEVar9 = (Exception *)((long)pEVar9->trace + (uVar8 - 0x68));
  if (uVar8 < uVar5) {
LAB_0041ad27:
    return (int)pEVar9 - iVar2;
  }
  dst = dst + uVar8;
LAB_0041ac68:
  if (pEVar9 == pEVar11) goto LAB_0041ad18;
  do {
    pEVar4 = (Exception *)lseek64(__fd,(__off64_t)pEVar9,3);
    if (-1 < (long)pEVar4) goto LAB_0041acde;
    iVar3 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar3 == -1);
  if (iVar3 != 0) {
    if (iVar3 != 6) {
      if (iVar3 == 0x16) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[51]>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                   ,0x27b,FAILED,(char *)0x0,
                   "\"can\'t determine hole size; SEEK_DATA not supported\"",
                   (char (*) [51])"can\'t determine hole size; SEEK_DATA not supported");
        kj::_::Debug::Fault::fatal(&f);
      }
      line = 0x285;
LAB_0041ad82:
      kj::_::Debug::Fault::Fault
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,line,iVar3,"lseek(fd, pos, SEEK_HOLE)","");
      kj::_::Debug::Fault::~Fault(&f);
      return (int)pEVar9 - iVar2;
    }
    do {
      pEVar4 = (Exception *)lseek64(__fd,0,2);
      if (-1 < (long)pEVar4) goto LAB_0041acc9;
      iVar3 = kj::_::Debug::getOsErrorNumber(false);
    } while (iVar3 == -1);
    if (iVar3 != 0) {
      kj::_::Debug::Fault::Fault
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,0x27f,iVar3,"nextData = lseek(otherFd, 0, SEEK_END)","");
      kj::_::Debug::Fault::fatal(&f);
    }
LAB_0041acc9:
    if ((long)pEVar11 < (long)pEVar4) {
      pEVar11 = pEVar4;
    }
  }
LAB_0041acde:
  if ((long)pEVar11 < (long)pEVar4) {
    pEVar4 = pEVar11;
  }
  size = (long)pEVar4 - (long)pEVar9;
  if (size != 0 && (long)pEVar9 <= (long)pEVar4) {
    DiskHandle::zero(this_00,(uint64_t)dst,size);
    dst = dst + size;
    pEVar9 = pEVar4;
  }
  if (pEVar9 == pEVar11) {
LAB_0041ad18:
    return (int)pEVar11 - iVar2;
  }
  goto LAB_0041aa67;
}

Assistant:

size_t copy(uint64_t offset, const ReadableFile& from,
              uint64_t fromOffset, uint64_t size) const override {
    KJ_IF_SOME(result, DiskHandle::copy(offset, from, fromOffset, size)) {
      return result;
    } else {
      return File::copy(offset, from, fromOffset, size);
    }